

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall GlobOpt::CollectMemsetStElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  RealCount *pRVar1;
  Opnd *pOVar2;
  RegOpnd *baseOpnd;
  BasicBlock *block;
  _func_int **value;
  MemOpList *pMVar3;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  OpndKind OVar7;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  StackSym *pSVar11;
  Value *srcVal;
  GlobOpt *this_00;
  InductionVariable *pIVar12;
  Type pSVar13;
  Type pSVar14;
  JITTimeFunctionBody *pJVar15;
  FunctionJITTimeInfo *pFVar16;
  char16 *pcVar17;
  char16 *pcVar18;
  GlobOpt *this_01;
  SymID local_c8 [2];
  SymID inductionSymID;
  Type pSStack_68;
  BailoutConstantValue constant;
  SymID local_3c;
  StackSym *local_38;
  
  OVar5 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar5 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x7d5,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar6) goto LAB_0044c240;
    *puVar10 = 0;
  }
  pOVar2 = instr->m_dst;
  OVar5 = IR::Opnd::GetKind(pOVar2);
  if (OVar5 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar6) goto LAB_0044c240;
    *puVar10 = 0;
  }
  baseOpnd = (RegOpnd *)pOVar2[1]._vptr_Opnd;
  this_01 = *(GlobOpt **)&pOVar2[1].m_valueType;
  OVar5 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_0044c240;
    *puVar10 = 0;
  }
  bVar6 = IsAllowedForMemOpt(this,instr,false,baseOpnd,(Opnd *)this_01);
  if (!bVar6) {
    return false;
  }
  pSVar11 = IR::Opnd::GetStackSym((Opnd *)baseOpnd);
  if (pSVar11 == (StackSym *)0x0) {
    pSVar11 = (StackSym *)0x0;
  }
  else if (pSVar11->m_type != TyVar) {
    pSVar11 = StackSym::GetVarEquivSym(pSVar11,(Func *)0x0);
  }
  if (pSVar11 == (StackSym *)0x0) {
    local_3c = 0xffffffff;
  }
  else {
    local_3c = (pSVar11->super_Sym).m_id;
  }
  pOVar2 = instr->m_src1;
  OVar5 = IR::Opnd::GetKind(pOVar2);
  if (OVar5 == OpndKindReg) {
    OVar5 = IR::Opnd::GetKind(pOVar2);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar6) goto LAB_0044c240;
      *puVar10 = 0;
    }
    block = this->currentBlock;
    srcVal = GlobOptBlockData::FindValue(&block->globOptData,(Sym *)pOVar2[1]._vptr_Opnd);
    bVar6 = OptIsInvariant(this,pOVar2,block,loop,srcVal,true,true);
    if (!bVar6) goto LAB_0044bce8;
    local_38 = IR::Opnd::GetStackSym(pOVar2);
  }
  else {
LAB_0044bce8:
    local_38 = (StackSym *)0x0;
  }
  pSStack_68 = (Type)0x0;
  constant.type = TyIllegal;
  constant._1_7_ = 0;
  OVar5 = IR::Opnd::GetKind(pOVar2);
  OVar7 = IR::Opnd::GetKind(pOVar2);
  if (OVar5 == OpndKindFloatConst) {
    if (OVar7 != OpndKindFloatConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x107,"(this->IsFloatConstOpnd())","Bad call to AsFloatConstOpnd()");
      if (!bVar6) goto LAB_0044c240;
      *puVar10 = 0;
    }
    constant._0_8_ = pOVar2[1]._vptr_Opnd;
    pSStack_68 = (Type)CONCAT71(pSStack_68._1_7_,10);
  }
  else {
    OVar5 = IR::Opnd::GetKind(pOVar2);
    if (OVar7 == OpndKindIntConst) {
      if (OVar5 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar6) goto LAB_0044c240;
        *puVar10 = 0;
      }
      value = pOVar2[1]._vptr_Opnd;
      OVar5 = IR::Opnd::GetKind(pOVar2);
      if (OVar5 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar6) goto LAB_0044c240;
        *puVar10 = 0;
      }
      BailoutConstantValue::InitIntConstValue
                ((BailoutConstantValue *)&pSStack_68,(IntConstType)value,pOVar2->m_type);
    }
    else if (OVar5 == OpndKindAddr) {
      OVar5 = IR::Opnd::GetKind(pOVar2);
      if (OVar5 != OpndKindAddr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
        if (!bVar6) goto LAB_0044c240;
        *puVar10 = 0;
      }
      BailoutConstantValue::InitVarConstValue
                ((BailoutConstantValue *)&pSStack_68,pOVar2[2]._vptr_Opnd);
    }
    else if (local_38 == (StackSym *)0x0) {
      if (DAT_015d346a != '\x01') {
        return false;
      }
      pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
      pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar8,uVar9);
      if (!bVar6) {
        pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
        pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemSetPhase,uVar8,uVar9);
        if (!bVar6) {
          return false;
        }
      }
      Output::Print(L"TRACE MemSet:");
      pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar15);
      pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar16,(wchar (*) [42])local_c8);
      uVar8 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar17,pcVar18,(ulong)uVar8);
      Output::Print(L"Source is not an invariant");
      IR::Instr::DumpByteCodeOffset(instr);
      pcVar17 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
      Output::Print(L" (%s)",pcVar17);
      Output::Print(L"\n");
      Output::Flush();
      return false;
    }
  }
  pSVar11 = IR::Opnd::GetStackSym((Opnd *)this_01);
  if (pSVar11 == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x800,"(indexOp->GetStackSym())","indexOp->GetStackSym()");
    if (!bVar6) goto LAB_0044c240;
    *puVar10 = 0;
  }
  this_00 = (GlobOpt *)IR::Opnd::GetStackSym((Opnd *)this_01);
  if (this_00 == (GlobOpt *)0x0) {
    this_00 = (GlobOpt *)0x0;
  }
  else if (*(IRType *)((long)&this_00->intConstantToValueMap + 4) != TyVar) {
    this_01 = this_00;
    this_00 = (GlobOpt *)StackSym::GetVarEquivSym((StackSym *)this_00,(Func *)0x0);
  }
  if (this_00 == (GlobOpt *)0x0) {
    local_c8[0] = 0xffffffff;
  }
  else {
    local_c8[0] = *(SymID *)&this_00->intConstantToStackSymMap;
  }
  pIVar12 = GetInductionVariable(this_01,local_c8[0],loop);
  if (pIVar12 == (InductionVariable *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x802,"(IsSymIDInductionVariable(inductionSymID, loop))",
                       "IsSymIDInductionVariable(inductionSymID, loop)");
    if (!bVar6) {
LAB_0044c240:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
  }
  Loop::EnsureMemOpVariablesInitialized(loop);
  bVar6 = JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,local_c8);
  pSVar13 = (Type)new<Memory::JitArenaAllocator>(0x28,this->func->topFunc->m_fg->alloc,0x3f1274);
  *(undefined4 *)((long)&pSVar13[1].next + 4) = 0;
  pSVar13[4].next = (Type)0x0;
  *(SymID *)&pSVar13->next = local_3c;
  *(SymID *)((long)&pSVar13->next + 4) = local_c8[0];
  pSVar13[2].next = pSStack_68;
  pSVar13[3].next = (Type)constant._0_8_;
  pSVar13[4].next = (Type)local_38;
  *(undefined1 *)&pSVar13[1].next = 1;
  *(bool *)((long)&pSVar13[1].next + 1) = bVar6;
  pMVar3 = loop->memOpInfo->candidates;
  pSVar14 = (Type)new<Memory::ArenaAllocator>
                            (0x10,(pMVar3->
                                  super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>
                                  ).allocator,0x366bee);
  pSVar14[1].next = pSVar13;
  pSVar14->next =
       (pMVar3->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
       super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pMVar3->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar14;
  pRVar1 = &(pMVar3->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
            super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return true;
}

Assistant:

bool
GlobOpt::CollectMemsetStElementI(IR::Instr *instr, Loop *loop)
{
    Assert(instr->GetDst()->IsIndirOpnd());
    IR::IndirOpnd *dst = instr->GetDst()->AsIndirOpnd();
    IR::Opnd *indexOp = dst->GetIndexOpnd();
    IR::RegOpnd *baseOp = dst->GetBaseOpnd()->AsRegOpnd();

    if (!IsAllowedForMemOpt(instr, true, baseOp, indexOp))
    {
        return false;
    }

    SymID baseSymID = GetVarSymID(baseOp->GetStackSym());

    IR::Opnd *srcDef = instr->GetSrc1();
    StackSym *srcSym = nullptr;
    if (srcDef->IsRegOpnd())
    {
        IR::RegOpnd* opnd = srcDef->AsRegOpnd();
        if (this->OptIsInvariant(opnd, this->currentBlock, loop, CurrentBlockData()->FindValue(opnd->m_sym), true, true))
        {
            srcSym = opnd->GetStackSym();
        }
    }

    BailoutConstantValue constant = {TyIllegal, 0};
    if (srcDef->IsFloatConstOpnd())
    {
        constant.InitFloatConstValue(srcDef->AsFloatConstOpnd()->m_value);
    }
    else if (srcDef->IsIntConstOpnd())
    {
        constant.InitIntConstValue(srcDef->AsIntConstOpnd()->GetValue(), srcDef->AsIntConstOpnd()->GetType());
    }
    else if (srcDef->IsAddrOpnd())
    {
        constant.InitVarConstValue(srcDef->AsAddrOpnd()->m_address);
    }
    else if(!srcSym)
    {
        TRACE_MEMOP_PHASE_VERBOSE(MemSet, loop, instr, _u("Source is not an invariant"));
        return false;
    }

    // Process the Index Operand
    Assert(indexOp->GetStackSym());
    SymID inductionSymID = GetVarSymID(indexOp->GetStackSym());
    Assert(IsSymIDInductionVariable(inductionSymID, loop));

    loop->EnsureMemOpVariablesInitialized();
    bool isIndexPreIncr = loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID);

    Loop::MemSetCandidate* memsetInfo = JitAnewStruct(this->func->GetTopFunc()->m_fg->alloc, Loop::MemSetCandidate);
    memsetInfo->base = baseSymID;
    memsetInfo->index = inductionSymID;
    memsetInfo->constant = constant;
    memsetInfo->srcSym = srcSym;
    memsetInfo->count = 1;
    memsetInfo->bIndexAlreadyChanged = isIndexPreIncr;
    loop->memOpInfo->candidates->Prepend(memsetInfo);
    return true;
}